

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::
     ReadRepeatedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
               (int param_1,uint32 tag,CodedInputStream *input,RepeatedField<long> *values)

{
  byte bVar1;
  int iVar2;
  uint8 *puVar3;
  bool bVar4;
  LogMessage *other;
  byte *pbVar5;
  int iVar6;
  unsigned_long uVar7;
  pair<unsigned_long,_bool> pVar8;
  pair<unsigned_long,_bool> pVar9;
  LogFinisher local_75;
  uint local_74;
  uint local_70;
  uint local_6c;
  LogMessage local_68;
  
  puVar3 = input->buffer_;
  if ((puVar3 < input->buffer_end_) && (uVar7 = (unsigned_long)(char)*puVar3, -1 < (long)uVar7)) {
    input->buffer_ = puVar3 + 1;
    pVar8._8_8_ = 1;
    pVar8.first = (unsigned_long)(puVar3 + 1);
  }
  else {
    pVar8 = io::CodedInputStream::ReadVarint64Fallback(input);
    uVar7 = pVar8.first;
  }
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_0043bea9:
    bVar4 = false;
  }
  else {
    if (values->current_size_ == values->total_size_) {
      RepeatedField<long>::Reserve(values,values->total_size_ + 1);
    }
    iVar6 = values->current_size_;
    values->current_size_ = iVar6 + 1;
    values->rep_->elements[iVar6] = uVar7;
    bVar4 = true;
    if (iVar6 + 1 < values->total_size_) {
      local_70 = tag & 0xff | 0x80;
      local_74 = tag >> 7;
      iVar6 = values->total_size_ - iVar6;
      local_6c = tag;
      do {
        if (local_6c < 0x80) {
          pbVar5 = input->buffer_;
          if ((input->buffer_end_ <= pbVar5) || (*pbVar5 != local_6c)) break;
          pbVar5 = pbVar5 + 1;
        }
        else {
          if ((((0x3fff < local_6c) ||
               (pbVar5 = input->buffer_, *(int *)&input->buffer_end_ - (int)pbVar5 < 2)) ||
              (local_70 != *pbVar5)) || (local_74 != pbVar5[1])) break;
          pbVar5 = pbVar5 + 2;
        }
        input->buffer_ = pbVar5;
        if ((pbVar5 < input->buffer_end_) && (bVar1 = *pbVar5, -1 < (long)(char)bVar1)) {
          input->buffer_ = pbVar5 + 1;
          pVar9._8_8_ = 1;
          pVar9.first = (long)(char)bVar1;
        }
        else {
          pVar9 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_0043bea9;
        if (values->total_size_ <= values->current_size_) {
          LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x456);
          other = LogMessage::operator<<
                            (&local_68,"CHECK failed: (current_size_) < (total_size_): ");
          LogFinisher::operator=(&local_75,other);
          LogMessage::~LogMessage(&local_68);
        }
        iVar2 = values->current_size_;
        values->current_size_ = iVar2 + 1;
        values->rep_->elements[iVar2] = pVar9.first;
        iVar6 = iVar6 + -1;
      } while (1 < iVar6);
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

inline bool WireFormatLite::ReadRepeatedPrimitive(
    int,  // tag_size, unused.
    uint32 tag,
    io::CodedInputStream* input,
    RepeatedField<CType>* values) {
  CType value;
  if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
  values->Add(value);
  int elements_already_reserved = values->Capacity() - values->size();
  while (elements_already_reserved > 0 && input->ExpectTag(tag)) {
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->AddAlreadyReserved(value);
    elements_already_reserved--;
  }
  return true;
}